

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O0

void __thiscall
QPlainTextEditSearchWidget::QPlainTextEditSearchWidget
          (QPlainTextEditSearchWidget *this,QPlainTextEdit *parent)

{
  QString *pQVar1;
  void *pvVar2;
  ConnectionType type;
  Object local_198 [8];
  code *local_190;
  undefined8 uStack_188;
  code *local_180;
  undefined8 local_178;
  Object local_170 [8];
  code *local_168;
  undefined8 uStack_160;
  code *local_158;
  undefined8 local_150;
  Object local_148 [8];
  code *local_140;
  undefined8 uStack_138;
  code *local_130;
  undefined8 local_128;
  Object local_120 [8];
  code *local_118;
  undefined8 uStack_110;
  code *local_108;
  undefined8 local_100;
  Object local_f8 [8];
  code *local_f0;
  undefined8 uStack_e8;
  code *local_e0;
  undefined8 local_d8;
  Object local_d0 [8];
  code *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 local_b0;
  Object local_a8 [8];
  code *local_a0;
  undefined8 uStack_98;
  code *local_90;
  undefined8 local_88;
  Object local_80 [8];
  QArrayDataPointer<char16_t> local_78;
  QString local_60;
  QFlags<Qt::WindowType> local_34;
  QPlainTextEdit *local_30;
  QPlainTextEdit *parent_local;
  QPlainTextEditSearchWidget *this_local;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  local_30 = parent;
  parent_local = (QPlainTextEdit *)this;
  QFlags<Qt::WindowType>::QFlags(&local_34);
  QWidget::QWidget((QWidget *)this,(QWidget *)parent,(QFlags_conflict1 *)(ulong)local_34.i);
  *(undefined ***)this = &PTR_metaObject_001a8920;
  *(undefined ***)(this + 0x10) = &PTR__QPlainTextEditSearchWidget_001a8ad0;
  pvVar2 = operator_new(0x90);
  *(void **)(this + 0x28) = pvVar2;
  QList<QTextEdit::ExtraSelection>::QList((QList<QTextEdit::ExtraSelection> *)(this + 0x38));
  QColor::QColor((QColor *)(this + 0x50),0,0xb4,0,100);
  QTimer::QTimer((QTimer *)(this + 0x60),(QObject *)0x0);
  QString::QString((QString *)(this + 0x70));
  Ui_QPlainTextEditSearchWidget::setupUi
            (*(Ui_QPlainTextEditSearchWidget **)(this + 0x28),(QWidget *)this);
  *(QPlainTextEdit **)(this + 0x88) = local_30;
  this[0x90] = (QPlainTextEditSearchWidget)0x0;
  QWidget::hide();
  pQVar1 = *(QString **)(*(long *)(this + 0x28) + 0x18);
  local_10 = &local_78;
  str = L"* {color: grey}";
  this_local = (QPlainTextEditSearchWidget *)anon_var_dwarf_445e9;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_78,(Data *)0x0,L"* {color: grey}",0xf);
  QString::QString(&local_60,&local_78);
  QWidget::setStyleSheet(pQVar1);
  QString::~QString(&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QWidget::setEnabled(SUB81(*(undefined8 *)(*(long *)(this + 0x28) + 0x18),0));
  *(undefined4 *)(this + 0x34) = 0;
  *(undefined4 *)(this + 0x30) = 0;
  local_90 = QAbstractButton::clicked;
  local_88 = 0;
  local_a0 = deactivate;
  uStack_98 = 0;
  type = (ConnectionType)this;
  QObject::connect<void(QAbstractButton::*)(bool),void(QPlainTextEditSearchWidget::*)()>
            (local_80,*(offset_in_QAbstractButton_to_subr *)(*(long *)(this + 0x28) + 0x38),
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  local_b8 = QLineEdit::textChanged;
  local_b0 = 0;
  local_c8 = searchLineEditTextChanged;
  uStack_c0 = 0;
  QObject::
  connect<void(QLineEdit::*)(QString_const&),void(QPlainTextEditSearchWidget::*)(QString_const&)>
            (local_a8,*(offset_in_QLineEdit_to_subr *)(*(long *)(this + 0x28) + 8),
             (Object *)QLineEdit::textChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  local_e0 = QAbstractButton::clicked;
  local_d8 = 0;
  local_f0 = doSearchDown;
  uStack_e8 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QPlainTextEditSearchWidget::*)()>
            (local_d0,*(offset_in_QAbstractButton_to_subr *)(*(long *)(this + 0x28) + 0x48),
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  local_108 = QAbstractButton::clicked;
  local_100 = 0;
  local_118 = doSearchUp;
  uStack_110 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QPlainTextEditSearchWidget::*)()>
            (local_f8,*(offset_in_QAbstractButton_to_subr *)(*(long *)(this + 0x28) + 0x28),
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_f8);
  local_130 = QAbstractButton::toggled;
  local_128 = 0;
  local_140 = setReplaceMode;
  uStack_138 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QPlainTextEditSearchWidget::*)(bool)>
            (local_120,*(offset_in_QAbstractButton_to_subr *)(*(long *)(this + 0x28) + 0x40),
             (Object *)QAbstractButton::toggled,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_120);
  local_158 = QAbstractButton::clicked;
  local_150 = 0;
  local_168 = doReplace;
  uStack_160 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),bool(QPlainTextEditSearchWidget::*)(bool)>
            (local_148,*(offset_in_QAbstractButton_to_subr *)(*(long *)(this + 0x28) + 0x80),
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_148);
  local_180 = QAbstractButton::clicked;
  local_178 = 0;
  local_190 = doReplaceAll;
  uStack_188 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QPlainTextEditSearchWidget::*)()>
            (local_170,*(offset_in_QAbstractButton_to_subr *)(*(long *)(this + 0x28) + 0x88),
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_170);
  QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QPlainTextEditSearchWidget::*)()>
            (local_198,(offset_in_QTimer_to_subr)(this + 0x60),(Object *)QTimer::timeout,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_198);
  QObject::installEventFilter((QObject *)this);
  QObject::installEventFilter(*(QObject **)(*(long *)(this + 0x28) + 8));
  QObject::installEventFilter(*(QObject **)(*(long *)(this + 0x28) + 0x10));
  return;
}

Assistant:

QPlainTextEditSearchWidget::QPlainTextEditSearchWidget(QPlainTextEdit *parent)
    : QWidget(parent),
      ui(new Ui::QPlainTextEditSearchWidget),
      selectionColor(0, 180, 0, 100) {
    ui->setupUi(this);
    _textEdit = parent;
    _darkMode = false;
    hide();
    ui->searchCountLabel->setStyleSheet(QStringLiteral("* {color: grey}"));
    // hiding will leave a open space in the horizontal layout
    ui->searchCountLabel->setEnabled(false);
    _currentSearchResult = 0;
    _searchResultCount = 0;

    connect(ui->closeButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::deactivate);
    connect(ui->searchLineEdit, &QLineEdit::textChanged, this,
            &QPlainTextEditSearchWidget::searchLineEditTextChanged);
    connect(ui->searchDownButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::doSearchDown);
    connect(ui->searchUpButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::doSearchUp);
    connect(ui->replaceToggleButton, &QPushButton::toggled, this,
            &QPlainTextEditSearchWidget::setReplaceMode);
    connect(ui->replaceButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::doReplace);
    connect(ui->replaceAllButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::doReplaceAll);

    connect(&_debounceTimer, &QTimer::timeout,
            this, &QPlainTextEditSearchWidget::performSearch);

    installEventFilter(this);
    ui->searchLineEdit->installEventFilter(this);
    ui->replaceLineEdit->installEventFilter(this);

#ifdef Q_OS_MAC
    // set the spacing to 8 for OS X
    layout()->setSpacing(8);
    ui->buttonFrame->layout()->setSpacing(9);

    // set the margin to 0 for the top buttons for OS X
    QString buttonStyle = QStringLiteral("QPushButton {margin: 0}");
    ui->closeButton->setStyleSheet(buttonStyle);
    ui->searchDownButton->setStyleSheet(buttonStyle);
    ui->searchUpButton->setStyleSheet(buttonStyle);
    ui->replaceToggleButton->setStyleSheet(buttonStyle);
    ui->matchCaseSensitiveButton->setStyleSheet(buttonStyle);
#endif
}